

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergePartialFromCodedStream
          (CodeGeneratorRequest *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  byte *pbVar2;
  char *data;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  UnknownFieldSet *unknown_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  Type *pTVar6;
  string *psVar7;
  Version *value_00;
  FileDescriptorProto *value_01;
  char cVar8;
  uint tag;
  ulong uVar9;
  
  this_00 = &this->file_to_generate_;
LAB_0026757b:
  pbVar2 = input->buffer_;
  uVar4 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_0026759f;
    input->buffer_ = pbVar2 + 1;
    uVar9 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_0026759f:
    uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
    uVar9 = 0;
    if (uVar4 - 1 < 0x7f) {
      uVar9 = 0x100000000;
    }
    uVar9 = uVar4 | uVar9;
  }
  tag = (uint)uVar9;
  if ((uVar9 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar9;
    if (uVar5 == 0xf) {
      if (cVar8 != 'z') goto LAB_002675c1;
      value_01 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add(&this->proto_file_);
      bVar3 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::FileDescriptorProto>
                        (input,value_01);
      goto LAB_002675f1;
    }
    if (uVar5 == 2) {
      if (cVar8 == '\x12') {
        psVar7 = mutable_parameter_abi_cxx11_(this);
        bVar3 = internal::WireFormatLite::ReadBytes(input,psVar7);
        if (!bVar3) {
          return false;
        }
        psVar7 = (this->parameter_).ptr_;
        internal::WireFormatLite::VerifyUtf8String
                  ((psVar7->_M_dataplus)._M_p,(int)psVar7->_M_string_length,PARSE,
                   "google.protobuf.compiler.CodeGeneratorRequest.parameter");
        goto LAB_0026757b;
      }
    }
    else {
      if (uVar5 == 3) {
        if (cVar8 == '\x1a') {
          value_00 = mutable_compiler_version(this);
          bVar3 = internal::WireFormatLite::
                  ReadMessageNoVirtual<google::protobuf::compiler::Version>(input,value_00);
          goto LAB_002675f1;
        }
        goto LAB_002675c1;
      }
      if ((uVar5 == 1) && (cVar8 == '\n')) {
        value = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Add(this_00);
        bVar3 = internal::WireFormatLite::ReadBytes(input,value);
        if (!bVar3) {
          return false;
        }
        pTVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ + -1)
        ;
        data = (pTVar6->_M_dataplus)._M_p;
        pTVar6 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ + -1)
        ;
        internal::WireFormatLite::VerifyUtf8String
                  (data,(int)pTVar6->_M_string_length,PARSE,
                   "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
        goto LAB_0026757b;
      }
    }
  }
LAB_002675c1:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  unknown_fields = mutable_unknown_fields(this);
  bVar3 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_002675f1:
  if (bVar3 == false) {
    return false;
  }
  goto LAB_0026757b;
}

Assistant:

bool CodeGeneratorRequest::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.compiler.CodeGeneratorRequest)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated string file_to_generate = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_file_to_generate()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->file_to_generate(this->file_to_generate_size() - 1).data(),
            this->file_to_generate(this->file_to_generate_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string parameter = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_parameter()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->parameter().data(), this->parameter().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorRequest.parameter");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_compiler_version()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_proto_file()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.compiler.CodeGeneratorRequest)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.compiler.CodeGeneratorRequest)
  return false;
#undef DO_
}